

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_start(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_creader *pCStack_20;
  CURLcode result;
  Curl_creader *r;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->req).field_0xd1 >> 7 & 1) != 0) {
    pCStack_20 = (data->req).reader_stack;
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"client start, rewind readers");
    }
    for (; pCStack_20 != (Curl_creader *)0x0; pCStack_20 = pCStack_20->next) {
      CVar1 = (*pCStack_20->crt->rewind)(data,pCStack_20);
      if (CVar1 != CURLE_OK) {
        Curl_failf(data,"rewind of client reader \'%s\' failed: %d",pCStack_20->crt->name,
                   (ulong)CVar1);
        return CVar1;
      }
    }
    *(uint *)&(data->req).field_0xd1 = *(uint *)&(data->req).field_0xd1 & 0xffffff7f;
    cl_reset_reader(data);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_client_start(struct Curl_easy *data)
{
  if(data->req.rewind_read) {
    struct Curl_creader *r = data->req.reader_stack;
    CURLcode result = CURLE_OK;

    CURL_TRC_READ(data, "client start, rewind readers");
    while(r) {
      result = r->crt->rewind(data, r);
      if(result) {
        failf(data, "rewind of client reader '%s' failed: %d",
              r->crt->name, result);
        return result;
      }
      r = r->next;
    }
    data->req.rewind_read = FALSE;
    cl_reset_reader(data);
  }
  return CURLE_OK;
}